

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noui.cpp
# Opt level: O0

bool noui_ThreadSafeQuestion(bilingual_str *param_1,string *message,string *caption,uint style)

{
  long lVar1;
  bool bVar2;
  string *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  bilingual_str *in_stack_ffffffffffffff48;
  uint in_stack_ffffffffffffffac;
  string *in_stack_ffffffffffffffb0;
  bilingual_str *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string(in_RDI,in_RSI);
  Untranslated(in_RDX);
  bVar2 = noui_ThreadSafeMessageBox
                    (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  bilingual_str::~bilingual_str(in_stack_ffffffffffffff48);
  std::__cxx11::string::~string(&in_stack_ffffffffffffff48->original);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool noui_ThreadSafeQuestion(const bilingual_str& /* ignored interactive message */, const std::string& message, const std::string& caption, unsigned int style)
{
    return noui_ThreadSafeMessageBox(Untranslated(message), caption, style);
}